

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::csharp::TryRemovePrefix_abi_cxx11_
          (string *__return_storage_ptr__,csharp *this,string_view prefix,string_view value)

{
  char *pcVar1;
  char *pcVar2;
  csharp *pcVar3;
  ulong uVar4;
  size_t sVar5;
  string prefix_to_match;
  long *local_50;
  ulong local_48;
  long local_40 [2];
  
  sVar5 = value._M_len;
  pcVar1 = prefix._M_str;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,anon_var_dwarf_a22956 + 5);
  if (this != (csharp *)0x0) {
    pcVar3 = (csharp *)0x0;
    do {
      if (pcVar3[prefix._M_len] != (csharp)0x5f) {
        std::__cxx11::string::push_back((char)&local_50);
      }
      pcVar3 = pcVar3 + 1;
    } while (this != pcVar3);
  }
  if (local_48 == 0) {
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar2 = (char *)0x0;
    uVar4 = 0;
    do {
      if (pcVar1 == pcVar2) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,sVar5,pcVar1 + sVar5);
        goto LAB_00de96f6;
      }
      if ((ulong)(byte)pcVar2[sVar5] != 0x5f) {
        if (absl::lts_20250127::ascii_internal::kToLower[(byte)pcVar2[sVar5]] !=
            *(char *)((long)local_50 + uVar4)) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)__return_storage_ptr__,sVar5,pcVar1 + sVar5);
          goto LAB_00de96f6;
        }
        uVar4 = uVar4 + 1;
      }
      pcVar2 = pcVar2 + 1;
    } while (uVar4 < local_48);
  }
  if (pcVar2 < pcVar1) {
    do {
      if (pcVar2[sVar5] != '_') goto LAB_00de968f;
      pcVar2 = pcVar2 + 1;
    } while (pcVar1 != pcVar2);
  }
  else {
LAB_00de968f:
    if (pcVar2 != pcVar1) {
      if (pcVar1 < pcVar2) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   pcVar2,pcVar1);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,pcVar2 + sVar5,pcVar1 + sVar5);
      goto LAB_00de96f6;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,sVar5,pcVar1 + sVar5);
LAB_00de96f6:
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TryRemovePrefix(absl::string_view prefix, absl::string_view value) {
  // First normalize to a lower-case no-underscores prefix to match against
  std::string prefix_to_match = "";
  for (size_t i = 0; i < prefix.size(); i++) {
    if (prefix[i] != '_') {
      prefix_to_match += absl::ascii_tolower(prefix[i]);
    }
  }

  // This keeps track of how much of value we've consumed
  size_t prefix_index, value_index;
  for (prefix_index = 0, value_index = 0;
       prefix_index < prefix_to_match.size() && value_index < value.size();
       value_index++) {
    // Skip over underscores in the value
    if (value[value_index] == '_') {
      continue;
    }
    if (absl::ascii_tolower(value[value_index]) !=
        prefix_to_match[prefix_index++]) {
      // Failed to match the prefix - bail out early.
      return std::string(value);
    }
  }

  // If we didn't finish looking through the prefix, we can't strip it.
  if (prefix_index < prefix_to_match.size()) {
    return std::string(value);
  }

  // Step over any underscores after the prefix
  while (value_index < value.size() && value[value_index] == '_') {
    value_index++;
  }

  // If there's nothing left (e.g. it was a prefix with only underscores
  // afterwards), don't strip.
  if (value_index == value.size()) {
    return std::string(value);
  }

  return std::string(value.substr(value_index));
}